

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

int __thiscall ON_OBSOLETE_V5_DimLinear::Repair(ON_OBSOLETE_V5_DimLinear *this)

{
  ON_Plane *this_00;
  V5_eAnnotationType VVar1;
  ON_2dPoint *pOVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  ON_2dVector local_58;
  double local_48;
  ON_3dPoint local_40;
  
  if ((this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count < 5)
  {
    return 0;
  }
  bVar3 = ON_2dPoint::IsValid((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                              super_ON_SimpleArray<ON_2dPoint>.m_a);
  if (!bVar3) {
    return 0;
  }
  bVar3 = ON_2dPoint::IsValid((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                              super_ON_SimpleArray<ON_2dPoint>.m_a + 2);
  if (!bVar3) {
    return 0;
  }
  this_00 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
  bVar3 = ON_Plane::IsValid(this_00);
  iVar5 = 1;
  if (!bVar3) {
    iVar5 = ON_Plane_Repair(this_00);
  }
  if ((5 < (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count
      ) && (iVar5 = 2,
           4 < (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
               m_capacity)) {
    (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count = 5;
  }
  ON_2dVector::ON_2dVector
            (&local_58,
             (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a);
  bVar3 = ON_2dVector::IsZero(&local_58);
  if (!bVar3) {
    ON_Plane::PointAt(&local_40,this_00,local_58.x,local_58.y);
    (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.z = local_40.z;
    (this_00->origin).x = local_40.x;
    (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.y = local_40.y;
    ON_Plane::UpdateEquation(this_00);
    local_58 = ON_2dVector::operator-(&local_58);
    lVar6 = 0;
    do {
      ON_2dPoint::operator+=
                ((ON_2dPoint *)
                 ((long)&((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                          super_ON_SimpleArray<ON_2dPoint>.m_a)->x + lVar6),&local_58);
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x50);
    ON_2dPoint::Set((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                    super_ON_SimpleArray<ON_2dPoint>.m_a,0.0,0.0);
    iVar5 = 2;
  }
  VVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_type;
  if (VVar1 != dtDimLinear) {
    if (VVar1 == dtDimAligned) {
      pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a
      ;
      if (((0.0 <= pOVar2[2].x) && (pOVar2[2].y == 0.0)) && (!NAN(pOVar2[2].y))) goto LAB_004aad64;
      if ((pOVar2[2].x <= 1.4901161193849998e-06) || (1.490116119385e-08 < ABS(pOVar2[2].y))) {
        ON_2dVector::operator=(&local_58,pOVar2 + 2);
        local_48 = ON_2dVector::Length(&local_58);
        ON_2dVector::Unitize(&local_58);
        ON_Plane::Rotate(this_00,local_58.y,local_58.x,
                         &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis,&this_00->origin);
        local_58.y = -local_58.y;
        lVar6 = 0;
        do {
          pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>
                   .m_a;
          dVar7 = *(double *)((long)&pOVar2->x + lVar6);
          dVar8 = *(double *)((long)&pOVar2->y + lVar6);
          ON_2dPoint::Set((ON_2dPoint *)((long)&pOVar2->x + lVar6),
                          local_58.x * dVar7 - dVar8 * local_58.y,
                          local_58.y * dVar7 + dVar8 * local_58.x);
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != 0x50);
        ON_2dPoint::Set((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                        super_ON_SimpleArray<ON_2dPoint>.m_a,0.0,0.0);
        ON_2dPoint::Set((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                        super_ON_SimpleArray<ON_2dPoint>.m_a + 2,local_48,0.0);
      }
      else {
        pOVar2[2].y = 0.0;
      }
    }
    else {
LAB_004aad64:
      (this->super_ON_OBSOLETE_V5_Annotation).m_type = dtDimLinear;
    }
    iVar5 = 2;
  }
  pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
  dVar7 = pOVar2->x;
  if ((pOVar2[1].x != dVar7) || (NAN(pOVar2[1].x) || NAN(dVar7))) {
    pOVar2[1].x = dVar7;
    iVar5 = 2;
  }
  dVar7 = pOVar2[2].x;
  if ((pOVar2[3].x != dVar7) || (NAN(pOVar2[3].x) || NAN(dVar7))) {
    pOVar2[3].x = dVar7;
    iVar5 = 2;
  }
  bVar3 = ON_IsValid(pOVar2[1].y);
  bVar4 = ON_IsValid((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                     super_ON_SimpleArray<ON_2dPoint>.m_a[3].y);
  if (bVar3) {
    pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    dVar7 = pOVar2[1].y;
    if (!bVar4) {
LAB_004aadfd:
      pOVar2[3].y = dVar7;
      goto LAB_004aae37;
    }
    dVar8 = pOVar2[3].y;
    if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
      dVar7 = (dVar7 + dVar8) * 0.5;
      pOVar2[1].y = dVar7;
      goto LAB_004aadfd;
    }
  }
  else {
    if (!bVar4) {
      pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a
      ;
      pOVar2[3].y = (pOVar2->y + pOVar2[2].y) * 0.5;
    }
    pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    pOVar2[1].y = pOVar2[3].y;
LAB_004aae37:
    iVar5 = 2;
  }
  if (((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext == true) &&
     (bVar3 = ON_2dPoint::IsValid((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                                  super_ON_SimpleArray<ON_2dPoint>.m_a + 4), !bVar3)) {
    (this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext = false;
    iVar5 = 2;
  }
  if ((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext == false) {
    pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    dVar7 = pOVar2[1].y;
    if ((pOVar2[4].y == dVar7) && (!NAN(pOVar2[4].y) && !NAN(dVar7))) {
      dVar8 = (pOVar2[1].x + pOVar2[3].x) * 0.5;
      if ((pOVar2[4].x == dVar8) && (!NAN(pOVar2[4].x) && !NAN(dVar8))) goto LAB_004aaeca;
    }
    pOVar2[4].y = dVar7;
    pOVar2[4].x = (pOVar2[1].x + pOVar2[3].x) * 0.5;
    iVar5 = 2;
  }
LAB_004aaeca:
  bVar3 = ON_Plane::IsValid(this_00);
  if (!bVar3) {
    ON_Plane_Repair(this_00);
    iVar5 = 2;
  }
  return iVar5;
}

Assistant:

int ON_OBSOLETE_V5_DimLinear::Repair()
{
  // returns 0 = unable to repair
  //         1 = in perfect condition
  //         2 == repaired.

  const int ext0_pt_index   = ON_OBSOLETE_V5_DimLinear::ext0_pt_index;
  const int arrow0_pt_index = ON_OBSOLETE_V5_DimLinear::arrow0_pt_index;
  const int ext1_pt_index   = ON_OBSOLETE_V5_DimLinear::ext1_pt_index;
  const int arrow1_pt_index = ON_OBSOLETE_V5_DimLinear::arrow1_pt_index;
  const int userpositionedtext_pt_index = ON_OBSOLETE_V5_DimLinear::userpositionedtext_pt_index;
  const int dim_pt_count    = ON_OBSOLETE_V5_DimLinear::dim_pt_count;

  int rc = 0;
  if (    m_points.Count() >= dim_pt_count 
       && m_points[ext0_pt_index].IsValid() 
       && m_points[ext1_pt_index].IsValid() )
  {
    rc = 1;
    if ( !m_plane.IsValid() )
    {
      rc = ON_Plane_Repair(m_plane);
    }

    if ( m_points.Count() > dim_pt_count )
    {
      rc = 2;
      m_points.SetCount(dim_pt_count);
    }

    // m_points[ext0_pt_index] must be at (0,0)
    ON_2dVector v = m_points[ext0_pt_index];
    double d;
    int i;
    if ( !v.IsZero() )
    {
      rc = 2;
      m_plane.origin = m_plane.PointAt(v.x,v.y);
      m_plane.UpdateEquation();
      v = -v;
      for ( i = 0; i < dim_pt_count; i++ )
      {
        m_points[i] += v;
      }
      m_points[ext0_pt_index].Set(0.0,0.0);
    }

    if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned == m_type && (m_points[ext1_pt_index].x < 0.0 || m_points[ext1_pt_index].y != 0.0) )
    {
      rc = 2;
      // Aligned dims must have m_points[ext1_pt_index].x = m_points[ext0_pt_index].x
      if (   m_points[ext1_pt_index].x > 100.0*ON_SQRT_EPSILON
          && fabs(m_points[ext1_pt_index].y) <= ON_SQRT_EPSILON )
      {
        m_points[ext1_pt_index].y = 0.0;
      }
      else
      {
        // Dimension line parallel to point0 -> point2
        // rotate the plane so p2 is on the x axis
        v = m_points[ext1_pt_index];
        d = v.Length();
        v.Unitize();
        m_plane.Rotate(v.y,v.x,m_plane.zaxis,m_plane.origin);

        // rotate points in opposite direction
        v.y = -v.y; 
        for ( i = 0; i < dim_pt_count; i++ )
        {
          ON_2dPoint p = m_points[i];
          m_points[i].Set( v.x*p.x - v.y*p.y, v.y*p.x + v.x*p.y );
        }
        m_points[ext0_pt_index].Set(0.0,0.0);
        m_points[ext1_pt_index].Set(d,0.0);
      }
    }
    else if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear != m_type )
    {
      rc = 2;
      m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear;
    }

    if ( m_points[arrow0_pt_index].x != m_points[ext0_pt_index].x )
    {
      rc = 2;
      m_points[arrow0_pt_index].x = m_points[ext0_pt_index].x;
    }

    if ( m_points[arrow1_pt_index].x != m_points[ext1_pt_index].x )
    {
      rc = 2;
      m_points[arrow1_pt_index].x = m_points[ext1_pt_index].x;
    }

    if ( !ON_IsValid(m_points[arrow0_pt_index].y) )
    {
      rc = 2;
      if ( !ON_IsValid(m_points[arrow1_pt_index].y) )
        m_points[arrow1_pt_index].y = 0.5*(m_points[ext0_pt_index].y + m_points[ext1_pt_index].y);
      m_points[arrow0_pt_index].y = m_points[arrow1_pt_index].y;
    }
    else if ( !ON_IsValid(m_points[arrow1_pt_index].y) )
    {
      rc = 2;
      m_points[arrow1_pt_index].y = m_points[arrow0_pt_index].y;
    }
    else if ( m_points[arrow0_pt_index].y != m_points[arrow1_pt_index].y )
    {
      rc = 2;
      d = 0.5*(m_points[arrow0_pt_index].y + m_points[arrow1_pt_index].y);
      m_points[arrow0_pt_index].y = d;
      m_points[arrow1_pt_index].y = d;
    }

    if ( m_userpositionedtext )
    {
      if ( !m_points[userpositionedtext_pt_index].IsValid() )
      {
        rc = 2;
        m_userpositionedtext = false;
      }
    }
    
    if ( !m_userpositionedtext )
    {
      if (    m_points[userpositionedtext_pt_index].y != m_points[arrow0_pt_index].y
           || m_points[userpositionedtext_pt_index].x != 0.5*(m_points[arrow0_pt_index].x + m_points[arrow1_pt_index].x) )
      {
        rc = 2;
        m_points[userpositionedtext_pt_index].y = m_points[arrow0_pt_index].y;
        m_points[userpositionedtext_pt_index].x = 0.5*(m_points[arrow0_pt_index].x + m_points[arrow1_pt_index].x);
      }
    }

    if ( !m_plane.IsValid() )
    {
      rc = 2;
      ON_Plane_Repair(m_plane);
    }
  }
  return rc;
}